

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

void __thiscall
LoopCrosser::LoopCrosser(LoopCrosser *this,S2Loop *a,S2Loop *b,LoopRelation *relation,bool swapped)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined3 in_register_00000081;
  
  this->a_ = a;
  this->b_ = b;
  this->relation_ = relation;
  this->swapped_ = swapped;
  iVar3 = (*relation->_vptr_LoopRelation[2])(relation);
  this->a_crossing_target_ = iVar3;
  iVar3 = (*relation->_vptr_LoopRelation[3])(relation);
  this->b_crossing_target_ = iVar3;
  (this->crosser_).a_cross_b_.c_[0] = 0.0;
  (this->crosser_).a_cross_b_.c_[1] = 0.0;
  (this->crosser_).a_cross_b_.c_[2] = 0.0;
  (this->crosser_).a_tangent_.c_[0] = 0.0;
  (this->crosser_).a_tangent_.c_[1] = 0.0;
  *(undefined1 (*) [16])((this->crosser_).a_tangent_.c_ + 2) = (undefined1  [16])0x0;
  (this->crosser_).b_tangent_.c_[1] = 0.0;
  (this->crosser_).b_tangent_.c_[2] = 0.0;
  S2CrossingEdgeQuery::S2CrossingEdgeQuery(&this->b_query_,&(b->index_).super_S2ShapeIndex);
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT31(in_register_00000081,swapped) != 0) {
    uVar1 = this->a_crossing_target_;
    uVar2 = this->b_crossing_target_;
    this->a_crossing_target_ = uVar2;
    this->b_crossing_target_ = uVar1;
  }
  return;
}

Assistant:

LoopCrosser(const S2Loop& a, const S2Loop& b,
              LoopRelation* relation, bool swapped)
      : a_(a), b_(b), relation_(relation), swapped_(swapped),
        a_crossing_target_(relation->a_crossing_target()),
        b_crossing_target_(relation->b_crossing_target()),
        b_query_(&b.index_) {
    using std::swap;
    if (swapped) swap(a_crossing_target_, b_crossing_target_);
  }